

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEAngle.cpp
# Opt level: O0

void __thiscall
CEAngle::SetAngle_DmsVect(CEAngle *this,vector<double,_std::allocator<double>_> *angle)

{
  double dVar1;
  char cVar2;
  const_reference pvVar3;
  size_type sVar4;
  undefined8 uVar5;
  vector<double,_std::allocator<double>_> *in_RSI;
  string *in_RDI;
  string msg;
  int err;
  double sec;
  double ang;
  char sign;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffda0;
  allocator *paVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffda8;
  value_type local_218;
  undefined6 in_stack_fffffffffffffdf8;
  undefined1 uVar7;
  char cVar8;
  undefined4 in_stack_fffffffffffffe00;
  undefined2 in_stack_fffffffffffffe04;
  undefined1 in_stack_fffffffffffffe06;
  undefined1 uVar9;
  allocator in_stack_fffffffffffffe07;
  string local_1f8 [8];
  CEAngleType *in_stack_fffffffffffffe10;
  double *in_stack_fffffffffffffe18;
  CEAngle *in_stack_fffffffffffffe20;
  string local_1d8 [32];
  string local_1b8 [32];
  string local_198 [38];
  undefined1 local_172;
  allocator local_171;
  string local_170 [32];
  string local_150 [32];
  string local_130 [32];
  string local_110 [38];
  undefined1 local_ea;
  allocator local_e9;
  string local_e8 [32];
  string local_c8 [32];
  string local_a8 [32];
  string local_88 [55];
  allocator local_51;
  string local_50 [36];
  int local_2c;
  value_type local_28;
  undefined8 local_20;
  char local_11;
  vector<double,_std::allocator<double>_> *local_10;
  
  local_10 = in_RSI;
  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,0);
  uVar7 = 0x2b;
  cVar8 = '-';
  if (0.0 <= *pvVar3) {
    cVar8 = '+';
  }
  local_20 = 0;
  local_11 = cVar8;
  sVar4 = std::vector<double,_std::allocator<double>_>::size(local_10);
  if (sVar4 == 4) {
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](local_10,2);
    dVar1 = *pvVar3;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](local_10,3);
    local_218 = dVar1 + *pvVar3;
  }
  else {
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](local_10,2);
    local_218 = *pvVar3;
  }
  cVar2 = local_11;
  local_28 = local_218;
  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](local_10,0);
  dVar1 = *pvVar3;
  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](local_10,1);
  local_2c = iauAf2a(local_28,(int)cVar2,(int)dVar1,(int)*pvVar3,&local_20);
  if (local_2c != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_50,"[ERROR] ",&local_51);
    std::allocator<char>::~allocator((allocator<char> *)&local_51);
    if (local_2c == 1) {
      std::vector<double,_std::allocator<double>_>::operator[](local_10,0);
      std::__cxx11::to_string((double)in_stack_fffffffffffffda8);
      std::operator+((char *)in_stack_fffffffffffffda8,in_stack_fffffffffffffda0);
      std::operator+(in_stack_fffffffffffffda8,(char *)in_stack_fffffffffffffda0);
      std::__cxx11::string::operator+=(local_50,local_88);
      std::__cxx11::string::~string(local_88);
      std::__cxx11::string::~string(local_a8);
      std::__cxx11::string::~string(local_c8);
      local_ea = 1;
      uVar5 = __cxa_allocate_exception(0xa8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_e8,"CEAngle::SetAngle_DmsVect",&local_e9);
      CEException::invalid_value::invalid_value
                ((invalid_value *)
                 CONCAT17(in_stack_fffffffffffffe07,
                          CONCAT16(in_stack_fffffffffffffe06,
                                   CONCAT24(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00))),
                 (string *)CONCAT17(cVar8,CONCAT16(uVar7,in_stack_fffffffffffffdf8)),in_RDI);
      local_ea = 0;
      __cxa_throw(uVar5,&CEException::invalid_value::typeinfo,
                  CEException::invalid_value::~invalid_value);
    }
    if (local_2c == 2) {
      std::vector<double,_std::allocator<double>_>::operator[](local_10,1);
      std::__cxx11::to_string((double)in_stack_fffffffffffffda8);
      std::operator+((char *)in_stack_fffffffffffffda8,in_stack_fffffffffffffda0);
      std::operator+(in_stack_fffffffffffffda8,(char *)in_stack_fffffffffffffda0);
      std::__cxx11::string::operator+=(local_50,local_110);
      std::__cxx11::string::~string(local_110);
      std::__cxx11::string::~string(local_130);
      std::__cxx11::string::~string(local_150);
      local_172 = 1;
      uVar5 = __cxa_allocate_exception(0xa8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_170,"CEAngle::SetAngle_DmsVect",&local_171);
      CEException::invalid_value::invalid_value
                ((invalid_value *)
                 CONCAT17(in_stack_fffffffffffffe07,
                          CONCAT16(in_stack_fffffffffffffe06,
                                   CONCAT24(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00))),
                 (string *)CONCAT17(cVar8,CONCAT16(uVar7,in_stack_fffffffffffffdf8)),in_RDI);
      local_172 = 0;
      __cxa_throw(uVar5,&CEException::invalid_value::typeinfo,
                  CEException::invalid_value::~invalid_value);
    }
    if (local_2c == 3) {
      std::__cxx11::to_string((double)in_stack_fffffffffffffda8);
      std::operator+((char *)in_stack_fffffffffffffda8,in_stack_fffffffffffffda0);
      std::operator+(in_stack_fffffffffffffda8,(char *)in_stack_fffffffffffffda0);
      std::__cxx11::string::operator+=(local_50,local_198);
      std::__cxx11::string::~string(local_198);
      std::__cxx11::string::~string(local_1b8);
      std::__cxx11::string::~string(local_1d8);
      uVar9 = 1;
      uVar5 = __cxa_allocate_exception(0xa8);
      paVar6 = (allocator *)&stack0xfffffffffffffe07;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1f8,"CEAngle::SetAngle_DmsVect",paVar6);
      CEException::invalid_value::invalid_value
                ((invalid_value *)
                 CONCAT17(in_stack_fffffffffffffe07,
                          CONCAT16(uVar9,CONCAT24(in_stack_fffffffffffffe04,
                                                  in_stack_fffffffffffffe00))),
                 (string *)CONCAT17(cVar8,CONCAT16(uVar7,in_stack_fffffffffffffdf8)),in_RDI);
      __cxa_throw(uVar5,&CEException::invalid_value::typeinfo,
                  CEException::invalid_value::~invalid_value);
    }
    std::__cxx11::string::~string(local_50);
  }
  SetAngle(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
  return;
}

Assistant:

void CEAngle::SetAngle_DmsVect(const std::vector<double>& angle)
{
    // Get the angle's sign
    char sign = (angle[0] < 0.0) ? '-' : '+';

    // Convert the values to an angle in degrees
    double ang(0.0);
    double sec = (angle.size() == 4) ? angle[2]+angle[3] : angle[2];

    // Pass the values to the appropriate SOFA algorithm
    int err = iauAf2a(sign, int(angle[0]), int(angle[1]), sec, &ang);

    // Handle the error
    if (err) {
        std::string msg = "[ERROR] ";
        switch(err) {
            // Hours out of bounds
            case 1:
                msg += "Degree value \'" + std::to_string(angle[0]) + "\' not in range 0-359";
                throw CEException::invalid_value("CEAngle::SetAngle_DmsVect", msg);
            // Minutes out of bounds
            case 2:
                msg += "Arcmin value \'" + std::to_string(angle[1]) + "\' not in range 0-59";
                throw CEException::invalid_value("CEAngle::SetAngle_DmsVect", msg);
            // Seconds out of bounds
            case 3:
                msg += "Arcsec value \'" + std::to_string(sec) + "\' not in range 0-59.999...";
                throw CEException::invalid_value("CEAngle::SetAngle_DmsVect", msg);
        }
    }

    // Set the angle
    SetAngle(ang, CEAngleType::RADIANS);
    return;
}